

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

arg_hashtable_t * arg_hashtable_create(uint minsize,_func_uint_void_ptr *hashfn,arg_comparefn *eqfn)

{
  arg_hashtable_entry **ppaVar1;
  double dVar2;
  uint local_38;
  uint local_34;
  uint size;
  uint pindex;
  arg_hashtable_t *h;
  arg_comparefn *eqfn_local;
  _func_uint_void_ptr *hashfn_local;
  arg_hashtable_t *paStack_10;
  uint minsize_local;
  
  local_38 = 0x35;
  if (minsize < 0x40000001) {
    for (local_34 = 0; local_34 < 0x1a; local_34 = local_34 + 1) {
      if (minsize < primes[local_34]) {
        local_38 = primes[local_34];
        break;
      }
    }
    paStack_10 = (arg_hashtable_t *)argtable3_xmalloc(0x30);
    ppaVar1 = (arg_hashtable_entry **)argtable3_xmalloc((ulong)local_38 << 3);
    paStack_10->table = ppaVar1;
    memset(paStack_10->table,0,(ulong)local_38 << 3);
    paStack_10->tablelength = local_38;
    paStack_10->primeindex = local_34;
    paStack_10->entrycount = 0;
    paStack_10->hashfn = hashfn;
    paStack_10->eqfn = eqfn;
    dVar2 = ceil((double)local_38 * 0.6499999761581421);
    paStack_10->loadlimit = (uint)(long)dVar2;
  }
  else {
    paStack_10 = (arg_hashtable_t *)0x0;
  }
  return paStack_10;
}

Assistant:

arg_hashtable_t* arg_hashtable_create(unsigned int minsize, unsigned int (*hashfn)(const void*), int (*eqfn)(const void*, const void*)) {
    arg_hashtable_t* h;
    unsigned int pindex;
    unsigned int size = primes[0];

    /* Check requested hash table isn't too large */
    if (minsize > (1u << 30))
        return NULL;

    /*
     * Enforce size as prime. The reason is to avoid clustering of values
     * into a small number of buckets (yes, distribution). A more even
     *  distributed hash table will perform more consistently.
     */
    for (pindex = 0; pindex < prime_table_length; pindex++) {
        if (primes[pindex] > minsize) {
            size = primes[pindex];
            break;
        }
    }

    h = (arg_hashtable_t*)xmalloc(sizeof(arg_hashtable_t));
    h->table = (struct arg_hashtable_entry**)xmalloc(sizeof(struct arg_hashtable_entry*) * size);
    memset(h->table, 0, size * sizeof(struct arg_hashtable_entry*));
    h->tablelength = size;
    h->primeindex = pindex;
    h->entrycount = 0;
    h->hashfn = hashfn;
    h->eqfn = eqfn;
    h->loadlimit = (unsigned int)ceil(size * (double)max_load_factor);
    return h;
}